

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O0

in_addr_t ngx_inet_addr(u_char *text,size_t len)

{
  byte bVar1;
  long local_40;
  ngx_uint_t n;
  ngx_uint_t octet;
  in_addr_t addr;
  u_char c;
  u_char *p;
  size_t len_local;
  u_char *text_local;
  
  octet._0_4_ = 0;
  n = 0;
  local_40 = 0;
  _addr = text;
  do {
    if (text + len <= _addr) {
      if (local_40 == 3) {
        text_local._4_4_ = htonl((int)octet * 0x100 + (int)n);
      }
      else {
        text_local._4_4_ = 0xffffffff;
      }
      return text_local._4_4_;
    }
    bVar1 = *_addr;
    if ((bVar1 < 0x30) || (0x39 < bVar1)) {
      if (bVar1 != 0x2e) {
        return 0xffffffff;
      }
      octet._0_4_ = (int)octet * 0x100 + (int)n;
      n = 0;
      local_40 = local_40 + 1;
    }
    else {
      n = n * 10 + (long)(int)(bVar1 - 0x30);
      if (0xff < n) {
        return 0xffffffff;
      }
    }
    _addr = _addr + 1;
  } while( true );
}

Assistant:

in_addr_t
ngx_inet_addr(u_char *text, size_t len)
{
    u_char      *p, c;
    in_addr_t    addr;
    ngx_uint_t   octet, n;

    addr = 0;
    octet = 0;
    n = 0;

    for (p = text; p < text + len; p++) {
        c = *p;

        if (c >= '0' && c <= '9') {
            octet = octet * 10 + (c - '0');

            if (octet > 255) {
                return INADDR_NONE;
            }

            continue;
        }

        if (c == '.') {
            addr = (addr << 8) + octet;
            octet = 0;
            n++;
            continue;
        }

        return INADDR_NONE;
    }

    if (n == 3) {
        addr = (addr << 8) + octet;
        return htonl(addr);
    }

    return INADDR_NONE;
}